

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int64_t estimate_wiener_var_norm(AV1_COMP *cpi,BLOCK_SIZE norm_block_size)

{
  byte bVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  BLOCK_SIZE in_SIL;
  AV1_COMP *in_RDI;
  double dVar5;
  double dVar6;
  int in_stack_00000014;
  double scaled_satd;
  int64_t sse;
  int64_t satd;
  int sb_wiener_var;
  int mi_col;
  int mi_row;
  double sb_count;
  double sb_wiener_log;
  int norm_step;
  int64_t norm_factor;
  AV1_COMMON *cm;
  int64_t local_78;
  int local_40;
  int local_3c;
  double local_38;
  double local_30;
  long local_20;
  
  local_20 = 1;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
  local_30 = 0.0;
  local_38 = 0.0;
  for (local_3c = 0; local_3c < (in_RDI->common).mi_params.mi_rows;
      local_3c = (uint)bVar1 + local_3c) {
    for (local_40 = 0; local_40 < (in_RDI->common).mi_params.mi_cols;
        local_40 = (uint)bVar1 + local_40) {
      iVar2 = get_var_perceptual_ai
                        ((AV1_COMP *)sse,scaled_satd._7_1_,scaled_satd._0_4_,in_stack_00000014);
      iVar3 = get_satd(in_RDI,in_SIL,local_3c,local_40);
      iVar4 = get_sse(in_RDI,in_SIL,local_3c,local_40);
      dVar5 = sqrt((double)iVar4);
      dVar6 = log((double)iVar2);
      local_30 = ((double)iVar3 / dVar5) * dVar6 + local_30;
      local_38 = (double)iVar3 / dVar5 + local_38;
    }
  }
  if (0.0 < local_38) {
    dVar5 = exp(local_30 / local_38);
    local_20 = (long)dVar5;
  }
  if (local_20 < 1) {
    local_78 = 1;
  }
  else {
    local_78 = local_20;
  }
  return local_78;
}

Assistant:

static int64_t estimate_wiener_var_norm(AV1_COMP *const cpi,
                                        const BLOCK_SIZE norm_block_size) {
  const AV1_COMMON *const cm = &cpi->common;
  int64_t norm_factor = 1;
  assert(norm_block_size >= BLOCK_16X16 && norm_block_size <= BLOCK_128X128);
  const int norm_step = mi_size_wide[norm_block_size];
  double sb_wiener_log = 0;
  double sb_count = 0;
  for (int mi_row = 0; mi_row < cm->mi_params.mi_rows; mi_row += norm_step) {
    for (int mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += norm_step) {
      const int sb_wiener_var =
          get_var_perceptual_ai(cpi, norm_block_size, mi_row, mi_col);
      const int64_t satd = get_satd(cpi, norm_block_size, mi_row, mi_col);
      const int64_t sse = get_sse(cpi, norm_block_size, mi_row, mi_col);
      const double scaled_satd = (double)satd / sqrt((double)sse);
      sb_wiener_log += scaled_satd * log(sb_wiener_var);
      sb_count += scaled_satd;
    }
  }
  if (sb_count > 0) norm_factor = (int64_t)(exp(sb_wiener_log / sb_count));
  norm_factor = AOMMAX(1, norm_factor);

  return norm_factor;
}